

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O1

int ForthToInt(Forth *forth)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  
  p_Var1 = &Forth2Int._M_t._M_impl.super__Rb_tree_header._M_header;
  if (Forth2Int._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &Forth2Int._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var2 = Forth2Int._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (*(Forth **)(p_Var2 + 1) >= forth) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(Forth **)(p_Var2 + 1) < forth];
    } while (p_Var2 != (_Base_ptr)0x0);
  }
  p_Var2 = &Forth2Int._M_t._M_impl.super__Rb_tree_header._M_header;
  if (((_Rb_tree_header *)p_Var1 != &Forth2Int._M_t._M_impl.super__Rb_tree_header) &&
     (p_Var2 = &Forth2Int._M_t._M_impl.super__Rb_tree_header._M_header,
     *(Forth **)(p_Var1 + 1) <= forth)) {
    p_Var2 = p_Var1;
  }
  if ((_Rb_tree_header *)p_Var2 != &Forth2Int._M_t._M_impl.super__Rb_tree_header) {
    return *(int *)&p_Var2[1]._M_parent;
  }
  __assert_fail("!\"wrong forth class instance is used\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp"
                ,0x69,"int ForthToInt(const cppforth::Forth *)");
}

Assistant:

int ForthToInt(const cppforth::Forth* forth){
	auto it=Forth2Int.find(forth);
	if (it != Forth2Int.end()){
		return it->second;
	}
	else {
		assert(!"wrong forth class instance is used");
		return 2;
	}
}